

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_listen_on_close(intptr_t uuid,fio_protocol_s *protocol)

{
  pid_t pVar1;
  __pid_t _Var2;
  fio_protocol_s *protocol_local;
  intptr_t uuid_local;
  
  free(protocol);
  cluster_data.uuid = -1;
  pVar1 = fio_parent_pid();
  _Var2 = getpid();
  if ((pVar1 == _Var2) && (fio_data->active != '\0')) {
    fio_stop();
  }
  return;
}

Assistant:

static void fio_cluster_listen_on_close(intptr_t uuid,
                                        fio_protocol_s *protocol) {
  free(protocol);
  cluster_data.uuid = -1;
  if (fio_parent_pid() == getpid()) {
#if DEBUG
    FIO_LOG_DEBUG("(%d) stopped listening for cluster connections",
                  (int)getpid());
#endif
    if (fio_data->active)
      fio_stop();
  }
  (void)uuid;
}